

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ostream * Eigen::operator<<(ostream *s,DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m)

{
  EvalReturnType _m;
  ostream *poVar1;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [55];
  allocator local_121;
  string local_120 [32];
  IOFormat local_100;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m_local;
  ostream *s_local;
  
  local_18 = m;
  m_local = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)s;
  _m = DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eval(m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120," ",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"\n",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"",&local_1f9);
  IOFormat::IOFormat(&local_100,-1,0,(string *)local_120,(string *)local_158,(string *)local_180,
                     (string *)local_1a8,(string *)local_1d0,(string *)local_1f8);
  poVar1 = internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>(s,_m,&local_100);
  IOFormat::~IOFormat(&local_100);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}